

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O2

int If_CutLutBalancePinDelays(If_Man_t *p,If_Cut_t *pCut,char *pPerm)

{
  uint uVar1;
  If_Obj_t *pIVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar5 = 0;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    if ((*(uint *)&pCut->field_0x1c & 0xff000000) == 0x1000000) {
      *pPerm = '\0';
      pIVar2 = If_CutLeaf(p,pCut,0);
      iVar5 = (int)(pIVar2->CutBest).Delay;
    }
    else {
      pcVar3 = If_CutDsdPerm(p,pCut);
      iVar5 = *p->pPars->pLutStruct + -0x30;
      uVar1 = *(uint *)&pCut->field_0x1c;
      if (iVar5 < (int)(uVar1 >> 0x18) == pCut->uMaskFunc < 1) {
        __assert_fail("(If_CutLeaveNum(pCut) > LutSize) == (pCut->uMaskFunc > 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                      ,0x155,"int If_CutLutBalancePinDelays(If_Man_t *, If_Cut_t *, char *)");
      }
      uVar7 = 0;
      for (uVar8 = 0; uVar8 < uVar1 >> 0x18; uVar8 = uVar8 + 1) {
        if (((int)(uVar1 >> 0x18) <= iVar5) ||
           (cVar6 = '\x02', ((uint)pCut->uMaskFunc >> (uVar7 & 0x1f) & 1) == 0)) {
          cVar6 = '\x01';
        }
        uVar1 = Abc_Lit2Var((int)pcVar3[uVar8]);
        pPerm[uVar1] = cVar6;
        uVar1 = *(uint *)&pCut->field_0x1c;
        uVar7 = uVar7 + 2;
      }
      iVar5 = -1;
      for (uVar8 = 0; uVar8 < uVar1 >> 0x18; uVar8 = uVar8 + 1) {
        pIVar2 = If_CutLeaf(p,pCut,(int)uVar8);
        iVar4 = (int)pPerm[uVar8] + (int)(pIVar2->CutBest).Delay;
        if (iVar5 <= iVar4) {
          iVar5 = iVar4;
        }
        uVar1 = *(uint *)&pCut->field_0x1c;
      }
    }
  }
  return iVar5;
}

Assistant:

int If_CutLutBalancePinDelays( If_Man_t * p, If_Cut_t * pCut, char * pPerm )
{
    if ( pCut->nLeaves == 0 ) // const
        return 0;
    if ( pCut->nLeaves == 1 ) // variable
    {
        pPerm[0] = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        char * pCutPerm = If_CutDsdPerm( p, pCut );
        int LutSize = p->pPars->pLutStruct[0] - '0';
        int i, Delay, DelayMax = -1;
        assert( (If_CutLeaveNum(pCut) > LutSize) == (pCut->uMaskFunc > 0) );
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            if ( If_CutLeaveNum(pCut) > LutSize && ((pCut->uMaskFunc >> (i << 1)) & 1) )
                pPerm[Abc_Lit2Var((int)pCutPerm[i])] = 2;
            else
                pPerm[Abc_Lit2Var((int)pCutPerm[i])] = 1;
        }
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            Delay = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay;
            DelayMax = Abc_MaxInt( DelayMax, Delay + (int)pPerm[i] );
        }
        return DelayMax;
    }
}